

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall spv::Builder::makeBoolDebugType(Builder *this,int size)

{
  unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
  *this_00;
  Id IVar1;
  Id IVar2;
  mapped_type *pmVar3;
  Instruction *pIVar4;
  int t;
  long lVar5;
  allocator<char> local_5d;
  Id local_5c;
  Instruction *type;
  string local_50;
  
  this_00 = &this->groupedDebugTypes;
  lVar5 = 0;
  local_5c = size;
  while( true ) {
    local_50._M_dataplus._M_p._0_4_ = 2;
    pmVar3 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,(key_type *)&local_50);
    if ((int)((ulong)((long)(pmVar3->
                            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pmVar3->
                           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                           )._M_impl.super__Vector_impl_data._M_start) >> 3) <= lVar5) break;
    local_50._M_dataplus._M_p._0_4_ = 2;
    pmVar3 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,(key_type *)&local_50);
    pIVar4 = (pmVar3->super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>).
             _M_impl.super__Vector_impl_data._M_start[lVar5];
    type = pIVar4;
    IVar1 = Instruction::getIdOperand(pIVar4,0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"bool",&local_5d);
    IVar2 = getStringId(this,&local_50);
    if ((IVar1 == IVar2) && (IVar1 = Instruction::getIdOperand(pIVar4,1), IVar1 == local_5c)) {
      IVar1 = Instruction::getIdOperand(pIVar4,2);
      std::__cxx11::string::_M_dispose();
      if (IVar1 == 2) goto LAB_003cdc1f;
    }
    else {
      std::__cxx11::string::_M_dispose();
    }
    lVar5 = lVar5 + 1;
  }
  pIVar4 = (Instruction *)::operator_new(0x60);
  IVar2 = this->uniqueId + 1;
  this->uniqueId = IVar2;
  IVar1 = makeVoidType(this);
  pIVar4->_vptr_Instruction = (_func_int **)&PTR__Instruction_00a5fd48;
  pIVar4->resultId = IVar2;
  pIVar4->typeId = IVar1;
  pIVar4->opCode = OpExtInst;
  (pIVar4->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (pIVar4->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (pIVar4->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar4->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar4->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (pIVar4->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pIVar4->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (pIVar4->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  pIVar4->block = (Block *)0x0;
  type = pIVar4;
  Instruction::reserveOperands(pIVar4,6);
  Instruction::addIdOperand(pIVar4,this->nonSemanticShaderDebugInfo);
  Instruction::addImmediateOperand(pIVar4,2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"bool",&local_5d);
  IVar1 = getStringId(this,&local_50);
  Instruction::addIdOperand(pIVar4,IVar1);
  std::__cxx11::string::_M_dispose();
  IVar1 = makeUintConstant(this,local_5c,false);
  Instruction::addIdOperand(pIVar4,IVar1);
  IVar1 = makeUintConstant(this,2,false);
  Instruction::addIdOperand(pIVar4,IVar1);
  IVar1 = makeUintConstant(this,0,false);
  Instruction::addIdOperand(pIVar4,IVar1);
  local_50._M_dataplus._M_p._0_4_ = 2;
  pmVar3 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,(key_type *)&local_50);
  std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back(pmVar3,&type);
  local_50._M_dataplus._M_p = (pointer)type;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_50);
  if ((Instruction *)local_50._M_dataplus._M_p != (Instruction *)0x0) {
    (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
  }
  Module::mapInstruction(&this->module,type);
  pIVar4 = type;
LAB_003cdc1f:
  return pIVar4->resultId;
}

Assistant:

Id Builder::makeBoolDebugType(int const size)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeBasic].size(); ++t) {
        type = groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeBasic][t];
        if (type->getIdOperand(0) == getStringId("bool") &&
            type->getIdOperand(1) == static_cast<unsigned int>(size) &&
            type->getIdOperand(2) == NonSemanticShaderDebugInfo100Boolean)
            return type->getResultId();
    }

    type = new Instruction(getUniqueId(), makeVoidType(), OpExtInst);
    type->reserveOperands(6);
    type->addIdOperand(nonSemanticShaderDebugInfo);
    type->addImmediateOperand(NonSemanticShaderDebugInfo100DebugTypeBasic);

    type->addIdOperand(getStringId("bool")); // name id
    type->addIdOperand(makeUintConstant(size)); // size id
    type->addIdOperand(makeUintConstant(NonSemanticShaderDebugInfo100Boolean)); // encoding id
    type->addIdOperand(makeUintConstant(NonSemanticShaderDebugInfo100None)); // flags id

    groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeBasic].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}